

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

LogicalExpr __thiscall
mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::OnBool
          (NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *this,bool value)

{
  LogicalConstant LVar1;
  
  LVar1 = BasicExprFactory<std::allocator<char>_>::MakeLogicalConstant
                    (&this->builder_->super_ExprFactory,value);
  return (LogicalExpr)
         LVar1.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_;
}

Assistant:

LogicalExpr OnBool(bool value) {
    return builder_.MakeLogicalConstant(value);
  }